

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialSums.h
# Opt level: O0

ulint __thiscall bwtil::PartialSums::getCount(PartialSums *this,symbol s)

{
  byte bVar1;
  uint16_t uVar2;
  reference pvVar3;
  ulint uVar4;
  char in_SIL;
  PartialSums *in_RDI;
  ulint count;
  uint offset_in_node;
  uint current_node;
  ulint local_28;
  uint local_18;
  ulong local_8;
  
  if (in_SIL == '\0') {
    local_8 = (ulong)(in_RDI->base_counter & 1);
  }
  else {
    local_18 = ((uint)in_RDI->nr_of_nodes - (uint)in_RDI->nr_of_leafs) +
               (int)((ulong)(byte)(in_SIL - 1U) / (ulong)(long)(int)(uint)in_RDI->d);
    bVar1 = in_RDI->d;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&in_RDI->nodes,(ulong)local_18);
    local_28 = getCounterNumber(in_RDI,*pvVar3,
                                (uint)((ulong)(byte)(in_SIL - 1U) % (ulong)(long)(int)(uint)bVar1));
    while (local_18 != 0) {
      bVar1 = childNumber(in_RDI,(uint16_t)local_18);
      uVar2 = parent(in_RDI,(uint16_t)local_18);
      local_18 = (uint)uVar2;
      if (bVar1 != 0) {
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&in_RDI->nodes,(ulong)local_18);
        uVar4 = getCounterNumber(in_RDI,*pvVar3,bVar1 - 1);
        local_28 = uVar4 + local_28;
      }
    }
    local_8 = local_28 + (in_RDI->base_counter & 1);
  }
  return local_8;
}

Assistant:

ulint getCount(symbol s){

	#ifdef DEBUG
		if(empty){
			cout << "ERROR (PartialSums): getCount() called on empty counter\n";
			exit(0);
		}
	#endif

		if(s==0)
			return base_counter;

		s--;

	#ifdef DEBUG
		if(s>=sigma){
			cout << "ERROR (PartialSums): symbol " << s << " not in alphabet.\n";
			exit(0);
		}
	#endif

		uint current_node = (nr_of_nodes - nr_of_leafs) + (s/d);//offset leafs + leaf number

		uint offset_in_node = s%d;//number of the counter inside the node

		ulint count = getCounterNumber(nodes[current_node],offset_in_node);

		while(current_node>0){//repeat while current node is not the root

			offset_in_node = childNumber(current_node);
			current_node = parent(current_node);

			if(offset_in_node>0)
				count += getCounterNumber(nodes[current_node],offset_in_node-1);

		}

		return count + base_counter;

	}